

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# samplers.cpp
# Opt level: O0

vector<pbrt::SamplerHandle,_std::allocator<pbrt::SamplerHandle>_> * __thiscall
pbrt::SobolSampler::Clone(SobolSampler *this,int n,Allocator alloc)

{
  size_type __n;
  SobolSampler *pSVar1;
  int in_EDX;
  SobolSampler *in_RSI;
  allocator_type *in_RDI;
  int i;
  SobolSampler *samplerMem;
  vector<pbrt::SamplerHandle,_std::allocator<pbrt::SamplerHandle>_> *samplers;
  size_t in_stack_ffffffffffffff88;
  SobolSampler *pSVar2;
  allocator_type *__a;
  vector<pbrt::SamplerHandle,_std::allocator<pbrt::SamplerHandle>_> *this_00;
  int local_3c;
  vector<pbrt::SamplerHandle,_std::allocator<pbrt::SamplerHandle>_> local_1e;
  
  local_1e.super__Vector_base<pbrt::SamplerHandle,_std::allocator<pbrt::SamplerHandle>_>._M_impl.
  super__Vector_impl_data._M_start._1_1_ = 0;
  __n = (size_type)in_EDX;
  this_00 = &local_1e;
  __a = in_RDI;
  local_1e.super__Vector_base<pbrt::SamplerHandle,_std::allocator<pbrt::SamplerHandle>_>._M_impl.
  super__Vector_impl_data._M_start._2_4_ = in_EDX;
  std::allocator<pbrt::SamplerHandle>::allocator((allocator<pbrt::SamplerHandle> *)0x75cdac);
  std::vector<pbrt::SamplerHandle,_std::allocator<pbrt::SamplerHandle>_>::vector(this_00,__n,__a);
  std::allocator<pbrt::SamplerHandle>::~allocator((allocator<pbrt::SamplerHandle> *)0x75cdcc);
  pSVar1 = pstd::pmr::polymorphic_allocator<std::byte>::allocate_object<pbrt::SobolSampler>
                     ((polymorphic_allocator<std::byte> *)in_RDI,in_stack_ffffffffffffff88);
  pSVar2 = pSVar1;
  for (local_3c = 0;
      local_3c <
      local_1e.super__Vector_base<pbrt::SamplerHandle,_std::allocator<pbrt::SamplerHandle>_>._M_impl
      .super__Vector_impl_data._M_start._2_4_; local_3c = local_3c + 1) {
    pstd::pmr::polymorphic_allocator<std::byte>::construct<pbrt::SobolSampler,pbrt::SobolSampler&>
              ((polymorphic_allocator<std::byte> *)
               ((long)&local_1e.
                       super__Vector_base<pbrt::SamplerHandle,_std::allocator<pbrt::SamplerHandle>_>
                       ._M_impl.super__Vector_impl_data._M_finish + 6),pSVar1 + local_3c,in_RSI);
    SamplerHandle::TaggedPointer<pbrt::SobolSampler>((SamplerHandle *)in_RDI,pSVar2);
    std::vector<pbrt::SamplerHandle,_std::allocator<pbrt::SamplerHandle>_>::operator[]
              ((vector<pbrt::SamplerHandle,_std::allocator<pbrt::SamplerHandle>_> *)__a,
               (long)local_3c);
    SamplerHandle::operator=((SamplerHandle *)in_RDI,(SamplerHandle *)pSVar2);
  }
  return (vector<pbrt::SamplerHandle,_std::allocator<pbrt::SamplerHandle>_> *)in_RDI;
}

Assistant:

std::vector<SamplerHandle> SobolSampler::Clone(int n, Allocator alloc) {
    std::vector<SamplerHandle> samplers(n);
    SobolSampler *samplerMem = (SobolSampler *)alloc.allocate_object<SobolSampler>(n);
    for (int i = 0; i < n; ++i) {
        alloc.construct(&samplerMem[i], *this);
        samplers[i] = &samplerMem[i];
    }
    return samplers;
}